

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infblock.c
# Opt level: O0

inflate_blocks_statef * inflate_blocks_new(z_streamp z,check_func c,uInt w)

{
  internal_state *piVar1;
  alloc_func p_Var2;
  inflate_blocks_statef *s;
  uInt w_local;
  check_func c_local;
  z_streamp z_local;
  
  z_local = (z_streamp)(*z->zalloc)(z->opaque,1,0x70);
  if (z_local != (z_streamp)0x0) {
    piVar1 = (internal_state *)(*z->zalloc)(z->opaque,8,0x5a0);
    z_local->state = piVar1;
    if (piVar1 == (internal_state *)0x0) {
      (*z->zfree)(z->opaque,z_local);
      z_local = (z_streamp)0x0;
    }
    else {
      p_Var2 = (alloc_func)(*z->zalloc)(z->opaque,1,w);
      z_local->zalloc = p_Var2;
      if (p_Var2 == (alloc_func)0x0) {
        (*z->zfree)(z->opaque,z_local->state);
        (*z->zfree)(z->opaque,z_local);
        z_local = (z_streamp)0x0;
      }
      else {
        z_local->zfree = (free_func)(z_local->zalloc + w);
        z_local->adler = (uLong)c;
        *(inflate_block_mode *)&z_local->next_in = TYPE;
        inflate_blocks_reset((inflate_blocks_statef *)z_local,z,(uLongf *)0x0);
      }
    }
  }
  return (inflate_blocks_statef *)z_local;
}

Assistant:

local inflate_blocks_statef *inflate_blocks_new( /* z, c, w) */
z_streamp z,
check_func c,
uInt w )
{
  inflate_blocks_statef *s;

  if ((s = (inflate_blocks_statef *)ZALLOC
       (z,1,sizeof(struct inflate_blocks_state))) == Z_NULL)
    return s;
  if ((s->hufts =
       (inflate_huft *)ZALLOC(z, sizeof(inflate_huft), MANY)) == Z_NULL)
  {
    ZFREE(z, s);
    return Z_NULL;
  }
  if ((s->window = (Bytef *)ZALLOC(z, 1, w)) == Z_NULL)
  {
    ZFREE(z, s->hufts);
    ZFREE(z, s);
    return Z_NULL;
  }
  s->end = s->window + w;
  s->checkfn = c;
  s->mode = TYPE;
  Tracev((stderr, "inflate:   blocks allocated\n"));
  inflate_blocks_reset(s, z, Z_NULL);
  return s;
}